

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O0

size_t __thiscall
cappuccino::tlru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)0>::
insert_range<std::vector<std::tuple<std::chrono::duration<long,std::ratio<1l,1000l>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::chrono::duration<long,std::ratio<1l,1000l>>,unsigned_long,std::__cxx11::string>>>>
          (tlru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)0> *this,
          vector<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *key_value_range,allow a)

{
  bool bVar1;
  reference __t;
  __tuple_element_t<0UL,_tuple<duration<long,_ratio<1L,_1000L>_>,_unsigned_long,_basic_string<char>_>_>
  *__rhs;
  __tuple_element_t<1UL,_tuple<duration<long,_ratio<1L,_1000L>_>,_unsigned_long,_basic_string<char>_>_>
  *key_00;
  __tuple_element_t<2UL,_tuple<duration<long,_ratio<1L,_1000L>_>,_unsigned_long,_basic_string<char>_>_>
  *value_00;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  expire_time;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  expired_time;
  type *value;
  type *key;
  type *ttl;
  __normal_iterator<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_50;
  iterator __end0;
  iterator __begin0;
  vector<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)0,_std::mutex>_> guard;
  size_t inserted;
  time_point now;
  allow a_local;
  vector<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *key_value_range_local;
  tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  
  now.__d.__r = (duration)(duration)a;
  inserted = std::chrono::_V2::steady_clock::now();
  guard._M_device = (mutex_type *)0x0;
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)0,_std::mutex>_>::lock_guard
            ((lock_guard<cappuccino::mutex<(cappuccino::thread_safe)0,_std::mutex>_> *)&__range3,
             (mutex_type *)this);
  __end0 = std::
           vector<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(key_value_range);
  local_50._M_current =
       (tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          vector<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end(key_value_range);
  while (bVar1 = __gnu_cxx::operator!=(&__end0,&local_50), bVar1) {
    __t = __gnu_cxx::
          __normal_iterator<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator*(&__end0);
    __rhs = std::
            get<0ul,std::chrono::duration<long,std::ratio<1l,1000l>>,unsigned_long,std::__cxx11::string>
                      (__t);
    key_00 = std::
             get<1ul,std::chrono::duration<long,std::ratio<1l,1000l>>,unsigned_long,std::__cxx11::string>
                       (__t);
    value_00 = std::
               get<2ul,std::chrono::duration<long,std::ratio<1l,1000l>>,unsigned_long,std::__cxx11::string>
                         (__t);
    expire_time = std::chrono::operator+
                            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&inserted,__rhs);
    bVar1 = tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
            ::do_insert_update((tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
                                *)this,key_00,value_00,(time_point)inserted,
                               (time_point)expire_time.__d.__r,(allow)now.__d.__r);
    if (bVar1) {
      guard._M_device =
           (mutex_type *)((long)&((guard._M_device)->m_lock).super___mutex_base._M_mutex + 1);
    }
    __gnu_cxx::
    __normal_iterator<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end0);
  }
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)0,_std::mutex>_>::~lock_guard
            ((lock_guard<cappuccino::mutex<(cappuccino::thread_safe)0,_std::mutex>_> *)&__range3);
  return (size_t)guard._M_device;
}

Assistant:

auto insert_range(range_type&& key_value_range, allow a = allow::insert_or_update) -> size_t
    {
        auto   now = std::chrono::steady_clock::now();
        size_t inserted{0};

        {
            std::lock_guard guard{m_lock};
            for (auto& [ttl, key, value] : key_value_range)
            {
                auto expired_time = now + ttl;
                if (do_insert_update(key, std::move(value), now, expired_time, a))
                {
                    ++inserted;
                }
            }
        }

        return inserted;
    }